

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

optional<IndexType> index_type_from_string(string *type)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0x100000000;
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 == 0) {
      uVar2 = 2;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 == 0) {
        uVar2 = 3;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)type);
        if (iVar1 != 0) {
          uVar3 = 0;
        }
        uVar2 = 4;
      }
    }
  }
  return (optional<IndexType>)(uVar2 | uVar3);
}

Assistant:

std::optional<IndexType> index_type_from_string(const std::string &type) {
    if (type == "gram3") {
        return IndexType::GRAM3;
    }
    if (type == "text4") {
        return IndexType::TEXT4;
    }
    if (type == "hash4") {
        return IndexType::HASH4;
    }
    if (type == "wide8") {
        return IndexType::WIDE8;
    }
    return std::nullopt;
}